

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O0

void __thiscall
xLearn::RecallMetricTest_recall_test_Test::~RecallMetricTest_recall_test_Test
          (RecallMetricTest_recall_test_Test *this)

{
  Test *in_RDI;
  
  testing::Test::~Test(in_RDI);
  return;
}

Assistant:

TEST(RecallMetricTest, recall_test) {
  std::vector<real_t> Y;
  Y.push_back(1.0);
  Y.push_back(1.0);
  Y.push_back(-1.0);
  Y.push_back(-1.0);
  std::vector<real_t> pred;
  pred.push_back(100);
  pred.push_back(32);
  pred.push_back(12);
  pred.push_back(-21);
  RecallMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (2.0 / 2.0));
  metric.Reset();
  Y[0] = 1.0;
  Y[1] = -1.0;
  Y[2] = 1.0;
  Y[3] = -1.0;
  pred[0] = 12;
  pred[1] = 12;
  pred[2] = -12;
  pred[3] = -12;
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (1.0 / 2.0));
  EXPECT_EQ(metric.metric_type(), "Recall");
}